

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

StringRef __thiscall
llvm::yaml::
ScalarTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::input(ScalarTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
        *this,StringRef Scalar,void *param_2,string *Val)

{
  string local_48;
  undefined1 local_28 [8];
  StringRef Scalar_local;
  
  Scalar_local.Data = Scalar.Data;
  local_28 = (undefined1  [8])this;
  StringRef::str_abi_cxx11_(&local_48,(StringRef *)local_28);
  std::__cxx11::string::operator=((string *)param_2,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return (StringRef)ZEXT816(0);
}

Assistant:

StringRef ScalarTraits<std::string>::input(StringRef Scalar, void *,
                                         std::string &Val) {
  Val = Scalar.str();
  return StringRef();
}